

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::eval_faceForward_vec2(ShaderEvalContext *c)

{
  VecAccess<float,_4,_2> local_40;
  undefined1 local_30 [8];
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_20,(int)c + 0x30,3);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_28,(int)local_10 + 0x40,1);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_30,(int)local_10 + 0x50,2);
  tcu::faceForward<float,2>
            ((tcu *)&local_18,(Vector<float,_2> *)local_20,(Vector<float,_2> *)local_28,
             (Vector<float,_2> *)local_30);
  local_40 = tcu::Vector<float,_4>::yz(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_40,&local_18);
  return;
}

Assistant:

void eval_refract_float	(ShaderEvalContext& c) { c.color.x()	= refract(c.in[0].z(),                 c.in[1].x(),                 c.in[2].y()); }